

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmpIO.cpp
# Opt level: O0

bool __thiscall AmpIO::ReadPowerStatus(AmpIO *this,uint index)

{
  uint32_t uVar1;
  uint32_t uVar2;
  undefined4 local_20;
  undefined1 local_19;
  uint32_t mask;
  bool ret;
  uint32_t status;
  uint index_local;
  AmpIO *this_local;
  
  uVar1 = BoardIO::ReadStatus((BoardIO *)this);
  local_19 = (uVar1 & 0x80000) != 0;
  uVar2 = BoardIO::GetHardwareVersion((BoardIO *)this);
  if (uVar2 == 0x44514c41) {
    local_20 = 0;
    if ((index & 1) != 0) {
      local_20 = 0x4000;
    }
    if ((index & 2) != 0) {
      local_20 = local_20 | 0x8000;
    }
    if (local_20 != 0) {
      local_19 = (uVar1 & local_20) == local_20;
    }
  }
  return local_19;
}

Assistant:

bool AmpIO::ReadPowerStatus(unsigned int index) const
{
    uint32_t status = ReadStatus();
    bool ret = status & MV_GOOD_BIT;
    if (GetHardwareVersion() == DQLA_String) {
        uint32_t mask = 0;
        if (index&1) mask |= DQLA_MV_GOOD_1;
        if (index&2) mask |= DQLA_MV_GOOD_2;
        if (mask != 0)
            ret = ((status & mask) == mask);
    }
    return ret;

}